

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  State *pSVar4;
  State *pSVar5;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *extraout_RDX_01;
  StringPiece *prefix;
  uint uVar6;
  int j;
  State *s;
  RWLocker l;
  map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  State *local_118;
  uint local_10c;
  pthread_rwlock_t *local_108;
  ulong local_100;
  RWLocker local_f8;
  _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  local_e8;
  string local_b8;
  pointer local_98;
  undefined4 local_90;
  SearchParams local_88;
  
  if (this->init_failed_ != false) {
    return false;
  }
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8.mu_ = &this->cache_mutex_;
  local_f8.writing_ = false;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar2 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_f8.mu_);
  if (iVar2 != 0) goto LAB_00127810;
  local_88.text.ptr_ = (char *)0x0;
  local_88.text.length_ = 0;
  local_88.context.ptr_ = (char *)0x0;
  local_88.context.length_ = 0;
  local_88.run_forward = false;
  local_88.start = (State *)0x0;
  local_88.firstbyte = -1;
  local_88.cache_lock = &local_f8;
  local_88.failed = false;
  local_88.ep = (char *)0x0;
  local_88.matches = (vector<int,_std::allocator<int>_> *)0x0;
  local_88.anchored = true;
  local_88.want_earliest_match = false;
  bVar1 = AnalyzeSearch(this,&local_88);
  pSVar5 = local_88.start;
  if ((!bVar1) || (local_88.start == (State *)0x2)) {
    bVar1 = false;
    goto LAB_00127585;
  }
  if (local_88.start == (State *)0x1) {
    std::__cxx11::string::_M_replace((ulong)min,0,(char *)min->_M_string_length,0x13d548);
    bVar1 = true;
    std::__cxx11::string::_M_replace((ulong)max,0,(char *)max->_M_string_length,0x13d548);
    goto LAB_00127585;
  }
  local_118 = local_88.start;
  min->_M_string_length = 0;
  *(min->_M_dataplus)._M_p = '\0';
  local_108 = (pthread_rwlock_t *)&this->mutex_;
  iVar2 = pthread_rwlock_wrlock(local_108);
  if (iVar2 != 0) goto LAB_00127810;
  local_10c = maxlen;
  if (0 < maxlen) {
    local_100 = 0;
    while (pmVar3 = std::
                    map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                    ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                                  *)&local_e8,&local_118), *pmVar3 < 1) {
      pmVar3 = std::
               map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
               ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                             *)&local_e8,&local_118);
      *pmVar3 = *pmVar3 + 1;
      pSVar4 = RunStateOnByte(this,local_118,0x100);
      if (pSVar4 != (State *)0x1) {
        if (pSVar4 == (State *)0x0) goto LAB_001277b5;
        if ((pSVar4 == (State *)0x2) || ((pSVar4->flag_ & 0x1000) != 0)) break;
      }
      iVar2 = 0;
      while( true ) {
        pSVar4 = RunStateOnByte(this,local_118,iVar2);
        if (pSVar4 == (State *)0x0) goto LAB_001277b5;
        if ((pSVar4 == (State *)0x2) || (((State *)0x2 < pSVar4 && (0 < pSVar4->ninst_)))) break;
        iVar2 = iVar2 + 1;
        if (iVar2 == 0x100) goto LAB_001276b0;
      }
      std::__cxx11::string::_M_replace_aux((ulong)min,min->_M_string_length,0,'\x01');
      uVar6 = (int)local_100 + 1;
      local_100 = (ulong)uVar6;
      local_118 = pSVar4;
      if (uVar6 == local_10c) break;
    }
  }
LAB_001276b0:
  std::
  _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  ::clear(&local_e8);
  local_118 = pSVar5;
  max->_M_string_length = 0;
  *(max->_M_dataplus)._M_p = '\0';
  prefix = extraout_RDX;
  if (0 < (int)local_10c) {
    uVar6 = 0;
    do {
      pmVar3 = std::
               map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
               ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                             *)&local_e8,&local_118);
      prefix = extraout_RDX_00;
      if (0 < *pmVar3) break;
      pmVar3 = std::
               map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
               ::operator[]((map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                             *)&local_e8,&local_118);
      *pmVar3 = *pmVar3 + 1;
      iVar2 = 0xff;
      while( true ) {
        pSVar5 = RunStateOnByte(this,local_118,iVar2);
        if (pSVar5 == (State *)0x0) goto LAB_001277b5;
        if ((pSVar5 == (State *)0x2) || (((State *)0x2 < pSVar5 && (0 < pSVar5->ninst_)))) break;
        bVar1 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        if (bVar1) {
          bVar1 = true;
          goto LAB_001277bc;
        }
      }
      std::__cxx11::string::_M_replace_aux((ulong)max,max->_M_string_length,0,'\x01');
      uVar6 = uVar6 + 1;
      prefix = extraout_RDX_01;
      local_118 = pSVar5;
    } while (uVar6 != local_10c);
  }
  local_98 = (max->_M_dataplus)._M_p;
  local_90 = (undefined4)max->_M_string_length;
  PrefixSuccessor_abi_cxx11_(&local_b8,(re2 *)&local_98,prefix);
  std::__cxx11::string::operator=((string *)max,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  bVar1 = max->_M_string_length != 0;
LAB_001277bc:
  iVar2 = pthread_rwlock_unlock(local_108);
  if (iVar2 == 0) {
LAB_00127585:
    RWLocker::~RWLocker(&local_f8);
    std::
    _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
    ::~_Rb_tree(&local_e8);
    return bVar1;
  }
LAB_00127810:
  abort();
LAB_001277b5:
  bVar1 = false;
  goto LAB_001277bc;
}

Assistant:

bool DFA::PossibleMatchRange(string* min, string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(NULL, NULL, &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and min=" << CEscape(*min);
      break;
    }
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and max=" << CEscape(*max);
      break;
    }
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  *max = PrefixSuccessor(*max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}